

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O0

char * __thiscall google::protobuf::FieldDescriptor::index(FieldDescriptor *this,char *__s,int __c)

{
  Descriptor *pDVar1;
  uint local_4;
  
  if (((byte)this[0x42] & 1) == 0) {
    pDVar1 = containing_type(this);
    local_4 = (uint)(((long)this - *(long *)(pDVar1 + 0x28)) / 0x98);
  }
  else if (*(long *)(this + 0x60) == 0) {
    local_4 = (uint)(((long)this - *(long *)(*(long *)(this + 0x28) + 0x80)) / 0x98);
  }
  else {
    local_4 = (uint)(((long)this - *(long *)(*(long *)(this + 0x60) + 0x50)) / 0x98);
  }
  return (char *)(ulong)local_4;
}

Assistant:

inline int FieldDescriptor::index() const {
  if (!is_extension_) {
    return static_cast<int>(this - containing_type()->fields_);
  } else if (extension_scope_ != nullptr) {
    return static_cast<int>(this - extension_scope_->extensions_);
  } else {
    return static_cast<int>(this - file_->extensions_);
  }
}